

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::Reserve
          (RepeatedField<unsigned_int> *this,int new_size)

{
  ulong uVar1;
  int iVar2;
  bool is_soo;
  
  uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
  iVar2 = 2;
  if ((uVar1 & 4) != 0) {
    iVar2 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (new_size <= iVar2) {
    return;
  }
  is_soo = (uVar1 & 4) == 0;
  iVar2 = protobuf::internal::SooRep::size(&this->soo_rep_,is_soo);
  Grow(this,is_soo,iVar2,new_size);
  return;
}

Assistant:

void RepeatedField<Element>::Reserve(int new_size) {
  const bool was_soo = is_soo();
  if (ABSL_PREDICT_FALSE(new_size > Capacity(was_soo))) {
    Grow(was_soo, size(was_soo), new_size);
  }
}